

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O3

bool duckdb::GreaterThan::Operation<double>(double *left,double *right)

{
  double input;
  double input_00;
  bool bVar1;
  bool bVar2;
  
  input = *left;
  input_00 = *right;
  bVar1 = Value::IsNan<double>(input);
  bVar2 = Value::IsNan<double>(input_00);
  return !bVar2 && (input_00 < input || bVar1);
}

Assistant:

bool GreaterThan::Operation(const double &left, const double &right) {
	return GreaterThanFloat<double>(left, right);
}